

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix-multiply.h
# Opt level: O2

void dynet::MatrixMultiply(Device_CPU *dev,Tensor *l,Tensor *r,Tensor *y,float *acc_scalar)

{
  float fVar1;
  uint b;
  uint bid;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *local_e8;
  Tensor *local_e0;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_d8;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_b8;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_98;
  undefined1 local_78 [72];
  
  fVar1 = *acc_scalar;
  Tensor::tbvec((TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> *)&local_98,y);
  local_78._16_8_ =
       local_98.
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_cols.m_value;
  local_78._0_8_ =
       local_98.
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_data;
  local_78._8_8_ =
       local_98.
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_rows.m_value;
  local_78._24_4_ = fVar1;
  Tensor::tbvec((TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> *)&local_b8,y);
  local_d8.
  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)dev->edevice;
  local_d8.
  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_rows.m_value = (long)&local_b8;
  Eigen::
  TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
  ::operator=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
               *)&local_d8,
              (TensorCwiseUnaryOp<Eigen::internal::bind1st_op<Eigen::internal::scalar_product_op<float,_float>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>
               *)local_78);
  if (((l->d).bd == 1) && ((r->d).bd == (y->d).bd)) {
    Tensor::operator*(&local_98,l);
    Tensor::colbatch_matrix(&local_b8,r);
    Eigen::
    Product<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>
    ::Product((Product<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               *)local_78,&local_98,&local_b8);
    Tensor::colbatch_matrix(&local_d8,y);
    local_e8 = &local_d8;
    Eigen::
    NoAlias<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>::
    operator+=((NoAlias<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>
                *)&local_e8,
               (MatrixBase<Eigen::Product<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                *)local_78);
  }
  else {
    local_e0 = r;
    for (bid = 0; bid < (y->d).bd; bid = bid + 1) {
      Tensor::batch_matrix(&local_98,l,bid);
      Tensor::batch_matrix(&local_b8,local_e0,bid);
      Eigen::
      Product<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>
      ::Product((Product<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 *)local_78,&local_98,&local_b8);
      Tensor::batch_matrix(&local_d8,y,bid);
      local_e8 = &local_d8;
      Eigen::
      NoAlias<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>
      ::operator+=((NoAlias<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>
                    *)&local_e8,
                   (MatrixBase<Eigen::Product<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                    *)local_78);
    }
  }
  return;
}

Assistant:

inline void MatrixMultiply(const Device_CPU & dev, const Tensor& l, const Tensor& r, Tensor& y, const float* acc_scalar) {

  y.tbvec().device(*dev.edevice) = *acc_scalar * y.tbvec();

  if(l.d.bd == 1 && r.d.bd == y.d.bd) {

      // If the left side has one batch, multiply by columns
      // [x, z, b] = [x, y] * [y, z, b]
      // -> [x, z*b] = [x, y], [y, z*b]
      y.colbatch_matrix().noalias() += *l * r.colbatch_matrix();

  } else {
    // Otherwise, loop over the batches
    DYNET_ASSERT(r.d.bd != 1 || r.d.bd != l.d.bd,
                 "Number of batch elements in matrix multiply must match, but got: " << r.d.bd << ", " << l.d.bd);

    for(unsigned b = 0; b < y.d.bd; ++b)
      y.batch_matrix(b).noalias() += l.batch_matrix(b) * r.batch_matrix(b);

  }
}